

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstParamParser.cpp
# Opt level: O2

void __thiscall
SstParamParser::ParseParams(SstParamParser *this,IO *io,_SstParams *Params,UserOptions *userOptions)

{
  Params *this_00;
  _Rb_tree_header *p_Var1;
  _Alloc_hider _Var2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  size_type sVar6;
  size_type sVar7;
  allocator local_474;
  allocator local_473;
  allocator local_472;
  allocator local_471;
  string method;
  anon_class_8_1_3fcf65e4 lf_SetStringParameter;
  anon_class_8_1_3fcf65e4 lf_SetIntParameter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  anon_class_8_1_3fcf65e4 lf_SetBoolParameter;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  key_type local_2d0;
  string local_2b0;
  key_type local_290;
  key_type local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  key_type local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  key_type local_d0;
  key_type local_b0;
  string local_90;
  key_type local_70;
  string local_50 [32];
  
  memset(Params,0,0xa8);
  Params->verbose = (userOptions->sst).verbose;
  Params->MarshalMethod = 2;
  lf_SetStringParameter.io = io;
  lf_SetIntParameter.io = io;
  lf_SetBoolParameter.io = io;
  std::__cxx11::string::string((string *)&local_70,"MarshalMethod",&local_471);
  this_00 = &io->m_Parameters;
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_70);
  p_Var1 = &(io->m_Parameters)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
    std::__cxx11::string::string((string *)&method,(string *)(iVar5._M_node + 2));
    sVar6 = method._M_string_length;
    _Var2 = method._M_dataplus;
    for (sVar7 = 0; sVar6 != sVar7; sVar7 = sVar7 + 1) {
      iVar4 = tolower((int)_Var2._M_p[sVar7]);
      _Var2._M_p[sVar7] = (char)iVar4;
    }
    bVar3 = std::operator==(&method,"ffs");
    if (bVar3) {
      Params->MarshalMethod = 0;
    }
    else {
      bVar3 = std::operator==(&method,"bp");
      if (bVar3) {
        Params->MarshalMethod = 1;
      }
      else {
        bVar3 = std::operator==(&method,"bp5");
        if (bVar3) {
          Params->MarshalMethod = 2;
        }
        else {
          std::__cxx11::string::string((string *)&local_3d8,"Engine",&local_472);
          std::__cxx11::string::string((string *)&local_3f8,"SstParamParser",&local_473);
          std::__cxx11::string::string((string *)&local_418,"ParseParams",&local_474);
          std::operator+(&local_3b8,"Unknown Sst MarshalMethod parameter \"",&method);
          std::operator+(&local_438,&local_3b8,"\"");
          adios2::helper::Throw<std::invalid_argument>
                    (&local_3d8,&local_3f8,&local_418,&local_438,-1);
          std::__cxx11::string::~string((string *)&local_438);
          std::__cxx11::string::~string((string *)&local_3b8);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::__cxx11::string::~string((string *)&local_3d8);
        }
      }
    }
    std::__cxx11::string::~string((string *)&method);
  }
  std::__cxx11::string::~string((string *)&local_70);
  Params->verbose = 0;
  std::__cxx11::string::string((string *)&local_90,"verbose",(allocator *)&method);
  ParseParams::anon_class_8_1_3fcf65e4::operator()(&lf_SetIntParameter,&local_90,&Params->verbose);
  std::__cxx11::string::~string((string *)&local_90);
  Params->RegistrationMethod = 0;
  std::__cxx11::string::string((string *)&local_b0,"RegistrationMethod",&local_471);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_b0);
  if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
    std::__cxx11::string::string((string *)&method,(string *)(iVar5._M_node + 2));
    sVar6 = method._M_string_length;
    _Var2 = method._M_dataplus;
    for (sVar7 = 0; sVar6 != sVar7; sVar7 = sVar7 + 1) {
      iVar4 = tolower((int)_Var2._M_p[sVar7]);
      _Var2._M_p[sVar7] = (char)iVar4;
    }
    bVar3 = std::operator==(&method,"file");
    if (bVar3) {
      Params->RegistrationMethod = 0;
    }
    else {
      bVar3 = std::operator==(&method,"screen");
      if (bVar3) {
        Params->RegistrationMethod = 1;
      }
      else {
        bVar3 = std::operator==(&method,"cloud");
        if (bVar3) {
          Params->RegistrationMethod = 2;
          std::__cxx11::string::string((string *)&local_3d8,"Engine",(allocator *)&local_3b8);
          std::__cxx11::string::string((string *)&local_3f8,"SstParamParser",&local_472);
          std::__cxx11::string::string((string *)&local_418,"ParseParams",&local_473);
          std::__cxx11::string::string
                    ((string *)&local_438,"Sst RegistrationMethod \"cloud\" not yet implemented",
                     &local_474);
          adios2::helper::Throw<std::invalid_argument>
                    (&local_3d8,&local_3f8,&local_418,&local_438,-1);
          this_01 = &local_438;
        }
        else {
          std::__cxx11::string::string((string *)&local_3d8,"Engine",&local_472);
          std::__cxx11::string::string((string *)&local_3f8,"SstParamParser",&local_473);
          std::__cxx11::string::string((string *)&local_418,"ParseParams",&local_474);
          std::operator+(&local_3b8,"Unknown Sst RegistrationMethod parameter \"",&method);
          std::operator+(&local_438,&local_3b8,"\"");
          adios2::helper::Throw<std::invalid_argument>
                    (&local_3d8,&local_3f8,&local_418,&local_438,-1);
          std::__cxx11::string::~string((string *)&local_438);
          this_01 = &local_3b8;
        }
        std::__cxx11::string::~string((string *)this_01);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_3d8);
      }
    }
    std::__cxx11::string::~string((string *)&method);
  }
  std::__cxx11::string::~string((string *)&local_b0);
  Params->StepDistributionMode = 0;
  std::__cxx11::string::string((string *)&local_d0,"StepDistributionMode",&local_471);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_d0);
  if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
    std::__cxx11::string::string((string *)&method,(string *)(iVar5._M_node + 2));
    sVar6 = method._M_string_length;
    _Var2 = method._M_dataplus;
    for (sVar7 = 0; sVar6 != sVar7; sVar7 = sVar7 + 1) {
      iVar4 = tolower((int)_Var2._M_p[sVar7]);
      _Var2._M_p[sVar7] = (char)iVar4;
    }
    bVar3 = std::operator==(&method,"alltoall");
    if (bVar3) {
      Params->StepDistributionMode = 0;
    }
    else {
      bVar3 = std::operator==(&method,"roundrobin");
      if (bVar3) {
        Params->StepDistributionMode = 1;
      }
      else {
        bVar3 = std::operator==(&method,"ondemand");
        if (bVar3) {
          Params->StepDistributionMode = 2;
        }
        else {
          std::__cxx11::string::string((string *)&local_3d8,"Engine",&local_472);
          std::__cxx11::string::string((string *)&local_3f8,"SstParamParser",&local_473);
          std::__cxx11::string::string((string *)&local_418,"ParseParams",&local_474);
          std::operator+(&local_3b8,"Unknown Sst StepDistributionMode parameter \"",&method);
          std::operator+(&local_438,&local_3b8,"\"");
          adios2::helper::Throw<std::invalid_argument>
                    (&local_3d8,&local_3f8,&local_418,&local_438,-1);
          std::__cxx11::string::~string((string *)&local_438);
          std::__cxx11::string::~string((string *)&local_3b8);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::__cxx11::string::~string((string *)&local_3d8);
        }
      }
    }
    std::__cxx11::string::~string((string *)&method);
  }
  std::__cxx11::string::~string((string *)&local_d0);
  Params->DataTransport = (char *)0x0;
  std::__cxx11::string::string((string *)&local_f0,"DataTransport",(allocator *)&method);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (&lf_SetStringParameter,&local_f0,&Params->DataTransport);
  std::__cxx11::string::~string((string *)&local_f0);
  Params->WANDataTransport = (char *)0x0;
  std::__cxx11::string::string((string *)&local_110,"WANDataTransport",(allocator *)&method);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (&lf_SetStringParameter,&local_110,&Params->WANDataTransport);
  std::__cxx11::string::~string((string *)&local_110);
  Params->OpenTimeoutSecs = 0x3c;
  std::__cxx11::string::string((string *)&local_130,"OpenTimeoutSecs",(allocator *)&method);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (&lf_SetIntParameter,&local_130,&Params->OpenTimeoutSecs);
  std::__cxx11::string::~string((string *)&local_130);
  Params->RendezvousReaderCount = 1;
  std::__cxx11::string::string((string *)&local_150,"RendezvousReaderCount",(allocator *)&method);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (&lf_SetIntParameter,&local_150,&Params->RendezvousReaderCount);
  std::__cxx11::string::~string((string *)&local_150);
  Params->QueueLimit = 0;
  std::__cxx11::string::string((string *)&local_170,"QueueLimit",(allocator *)&method);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (&lf_SetIntParameter,&local_170,&Params->QueueLimit);
  std::__cxx11::string::~string((string *)&local_170);
  Params->ReserveQueueLimit = 0;
  std::__cxx11::string::string((string *)&local_190,"ReserveQueueLimit",(allocator *)&method);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (&lf_SetIntParameter,&local_190,&Params->ReserveQueueLimit);
  std::__cxx11::string::~string((string *)&local_190);
  Params->QueueFullPolicy = 0;
  std::__cxx11::string::string((string *)&local_1b0,"QueueFullPolicy",&local_471);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_1b0);
  if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
    std::__cxx11::string::string((string *)&method,(string *)(iVar5._M_node + 2));
    sVar6 = method._M_string_length;
    _Var2 = method._M_dataplus;
    for (sVar7 = 0; sVar6 != sVar7; sVar7 = sVar7 + 1) {
      iVar4 = tolower((int)_Var2._M_p[sVar7]);
      _Var2._M_p[sVar7] = (char)iVar4;
    }
    bVar3 = std::operator==(&method,"block");
    if (bVar3) {
      Params->QueueFullPolicy = 0;
    }
    else {
      bVar3 = std::operator==(&method,"discard");
      if (bVar3) {
        Params->QueueFullPolicy = 1;
      }
      else {
        std::__cxx11::string::string((string *)&local_3d8,"Engine",&local_472);
        std::__cxx11::string::string((string *)&local_3f8,"SstParamParser",&local_473);
        std::__cxx11::string::string((string *)&local_418,"ParseParams",&local_474);
        std::operator+(&local_3b8,"Unknown Sst QueueFullPolicy parameter \"",&method);
        std::operator+(&local_438,&local_3b8,"\"");
        adios2::helper::Throw<std::invalid_argument>(&local_3d8,&local_3f8,&local_418,&local_438,-1)
        ;
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_3d8);
      }
    }
    std::__cxx11::string::~string((string *)&method);
  }
  std::__cxx11::string::~string((string *)&local_1b0);
  Params->IsRowMajor = 0;
  std::__cxx11::string::string(local_50,"IsRowMajor",(allocator *)&method);
  Params->IsRowMajor = (uint)(io->m_ArrayOrder == RowMajor);
  std::__cxx11::string::~string(local_50);
  Params->FirstTimestepPrecious = 0;
  std::__cxx11::string::string((string *)&local_1d0,"FirstTimestepPrecious",(allocator *)&method);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (&lf_SetBoolParameter,&local_1d0,&Params->FirstTimestepPrecious);
  std::__cxx11::string::~string((string *)&local_1d0);
  Params->ControlTransport = (char *)0x0;
  std::__cxx11::string::string((string *)&local_1f0,"ControlTransport",(allocator *)&method);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (&lf_SetStringParameter,&local_1f0,&Params->ControlTransport);
  std::__cxx11::string::~string((string *)&local_1f0);
  Params->NetworkInterface = (char *)0x0;
  std::__cxx11::string::string((string *)&local_210,"NetworkInterface",(allocator *)&method);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (&lf_SetStringParameter,&local_210,&Params->NetworkInterface);
  std::__cxx11::string::~string((string *)&local_210);
  Params->ControlInterface = (char *)0x0;
  std::__cxx11::string::string((string *)&local_230,"ControlInterface",(allocator *)&method);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (&lf_SetStringParameter,&local_230,&Params->ControlInterface);
  std::__cxx11::string::~string((string *)&local_230);
  Params->DataInterface = (char *)0x0;
  std::__cxx11::string::string((string *)&local_250,"DataInterface",(allocator *)&method);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (&lf_SetStringParameter,&local_250,&Params->DataInterface);
  std::__cxx11::string::~string((string *)&local_250);
  Params->CPCommPattern = 0;
  std::__cxx11::string::string((string *)&local_270,"CPCommPattern",&local_471);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_270);
  if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
    std::__cxx11::string::string((string *)&method,(string *)(iVar5._M_node + 2));
    sVar6 = method._M_string_length;
    _Var2 = method._M_dataplus;
    for (sVar7 = 0; sVar6 != sVar7; sVar7 = sVar7 + 1) {
      iVar4 = tolower((int)_Var2._M_p[sVar7]);
      _Var2._M_p[sVar7] = (char)iVar4;
    }
    bVar3 = std::operator==(&method,"min");
    if (bVar3) {
      Params->CPCommPattern = 0;
    }
    else {
      bVar3 = std::operator==(&method,"peer");
      if (bVar3) {
        Params->CPCommPattern = 1;
      }
      else {
        std::__cxx11::string::string((string *)&local_3d8,"Engine",&local_472);
        std::__cxx11::string::string((string *)&local_3f8,"SstParamParser",&local_473);
        std::__cxx11::string::string((string *)&local_418,"ParseParams",&local_474);
        std::operator+(&local_3b8,"Unknown Sst CPCommPattern parameter \"",&method);
        std::operator+(&local_438,&local_3b8,"\"");
        adios2::helper::Throw<std::invalid_argument>(&local_3d8,&local_3f8,&local_418,&local_438,-1)
        ;
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_3d8);
      }
    }
    std::__cxx11::string::~string((string *)&method);
  }
  std::__cxx11::string::~string((string *)&local_270);
  Params->CompressionMethod = 0;
  std::__cxx11::string::string((string *)&local_290,"CompressionMethod",&local_471);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_290);
  if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
    std::__cxx11::string::string((string *)&method,(string *)(iVar5._M_node + 2));
    sVar6 = method._M_string_length;
    _Var2 = method._M_dataplus;
    for (sVar7 = 0; sVar6 != sVar7; sVar7 = sVar7 + 1) {
      iVar4 = tolower((int)_Var2._M_p[sVar7]);
      _Var2._M_p[sVar7] = (char)iVar4;
    }
    bVar3 = std::operator==(&method,"zfp");
    if (bVar3) {
      Params->CompressionMethod = 1;
    }
    else {
      bVar3 = std::operator==(&method,"none");
      if (bVar3) {
        Params->CompressionMethod = 0;
      }
      else {
        std::__cxx11::string::string((string *)&local_3d8,"Engine",&local_472);
        std::__cxx11::string::string((string *)&local_3f8,"SstParamParser",&local_473);
        std::__cxx11::string::string((string *)&local_418,"ParseParams",&local_474);
        std::operator+(&local_3b8,"Unknown Sst CompressionMethod parameter \"",&method);
        std::operator+(&local_438,&local_3b8,"\"");
        adios2::helper::Throw<std::invalid_argument>(&local_3d8,&local_3f8,&local_418,&local_438,-1)
        ;
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_3d8);
      }
    }
    std::__cxx11::string::~string((string *)&method);
  }
  std::__cxx11::string::~string((string *)&local_290);
  Params->AlwaysProvideLatestTimestep = 0;
  std::__cxx11::string::string
            ((string *)&local_2b0,"AlwaysProvideLatestTimestep",(allocator *)&method);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (&lf_SetBoolParameter,&local_2b0,&Params->AlwaysProvideLatestTimestep);
  std::__cxx11::string::~string((string *)&local_2b0);
  Params->SpeculativePreloadMode = 2;
  std::__cxx11::string::string((string *)&local_2d0,"SpeculativePreloadMode",&local_471);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_2d0);
  if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
    std::__cxx11::string::string((string *)&method,(string *)(iVar5._M_node + 2));
    for (sVar6 = 0; method._M_string_length != sVar6; sVar6 = sVar6 + 1) {
      iVar4 = tolower((int)method._M_dataplus._M_p[sVar6]);
      method._M_dataplus._M_p[sVar6] = (char)iVar4;
    }
    bVar3 = std::operator==(&method,"off");
    if (bVar3) {
      Params->SpeculativePreloadMode = 0;
    }
    else {
      bVar3 = std::operator==(&method,"on");
      if (bVar3) {
        Params->SpeculativePreloadMode = 1;
      }
      else {
        bVar3 = std::operator==(&method,"auto");
        if (bVar3) {
          Params->SpeculativePreloadMode = 2;
        }
        else {
          std::__cxx11::string::string((string *)&local_3d8,"Engine",&local_472);
          std::__cxx11::string::string((string *)&local_3f8,"SstParamParser",&local_473);
          std::__cxx11::string::string((string *)&local_418,"ParseParams",&local_474);
          std::operator+(&local_3b8,"Unknown Sst SpeculativePreloadMode parameter \"",&method);
          std::operator+(&local_438,&local_3b8,"\"");
          adios2::helper::Throw<std::invalid_argument>
                    (&local_3d8,&local_3f8,&local_418,&local_438,-1);
          std::__cxx11::string::~string((string *)&local_438);
          std::__cxx11::string::~string((string *)&local_3b8);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::__cxx11::string::~string((string *)&local_3d8);
        }
      }
    }
    std::__cxx11::string::~string((string *)&method);
  }
  std::__cxx11::string::~string((string *)&local_2d0);
  Params->SpecAutoNodeThreshold = 1;
  std::__cxx11::string::string((string *)&local_2f0,"SpecAutoNodeThreshold",(allocator *)&method);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (&lf_SetIntParameter,&local_2f0,&Params->SpecAutoNodeThreshold);
  std::__cxx11::string::~string((string *)&local_2f0);
  Params->ReaderShortCircuitReads = 0;
  std::__cxx11::string::string((string *)&local_310,"ReaderShortCircuitReads",(allocator *)&method);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (&lf_SetBoolParameter,&local_310,&Params->ReaderShortCircuitReads);
  std::__cxx11::string::~string((string *)&local_310);
  Params->StatsLevel = 0;
  std::__cxx11::string::string((string *)&local_330,"StatsLevel",(allocator *)&method);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (&lf_SetIntParameter,&local_330,&Params->StatsLevel);
  std::__cxx11::string::~string((string *)&local_330);
  Params->UseOneTimeAttributes = 0;
  std::__cxx11::string::string((string *)&local_350,"UseOneTimeAttributes",(allocator *)&method);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (&lf_SetBoolParameter,&local_350,&Params->UseOneTimeAttributes);
  std::__cxx11::string::~string((string *)&local_350);
  Params->RemoteGroup = (char *)0x0;
  std::__cxx11::string::string((string *)&local_370,"RemoteGroup",(allocator *)&method);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (&lf_SetStringParameter,&local_370,&Params->RemoteGroup);
  std::__cxx11::string::~string((string *)&local_370);
  Params->ControlModule = (char *)0x0;
  std::__cxx11::string::string((string *)&local_390,"ControlModule",(allocator *)&method);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (&lf_SetStringParameter,&local_390,&Params->ControlModule);
  std::__cxx11::string::~string((string *)&local_390);
  return;
}

Assistant:

void SstParamParser::ParseParams(IO &io, struct _SstParams &Params,
                                 const adios2::UserOptions &userOptions)
{
    std::memset(&Params, 0, sizeof(Params));

    auto lf_SetBoolParameter = [&](const std::string key, int &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string value = itKey->second;
            std::transform(value.begin(), value.end(), value.begin(), ::tolower);
            if (value == "yes" || value == "true" || value == "on")
            {
                parameter = 1;
            }
            else if (value == "no" || value == "false" || value == "off")
            {
                parameter = 0;
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Unknown Sst Boolean parameter \"" + value +
                                                         "\"");
            }
        }
    };
    auto lf_SetIntParameter = [&](const std::string key, int &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            parameter = std::stoi(itKey->second);
            return true;
        }
        return false;
    };

    auto lf_SetStringParameter = [&](const std::string key, char *&parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            parameter = strdup(itKey->second.c_str());
            return true;
        }
        return false;
    };

    auto lf_SetRegMethodParameter = [&](const std::string key, size_t &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "file")
            {
                parameter = SstRegisterFile;
            }
            else if (method == "screen")
            {
                parameter = SstRegisterScreen;
            }
            else if (method == "cloud")
            {
                parameter = SstRegisterCloud;
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Sst RegistrationMethod "
                                                     "\"cloud\" not yet implemented");
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Unknown Sst RegistrationMethod parameter \"" +
                                                         method + "\"");
            }
            return true;
        }
        return false;
    };

    auto lf_SetCompressionMethodParameter = [&](const std::string key, size_t &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "zfp")
            {
                parameter = SstCompressZFP;
            }
            else if (method == "none")
            {
                parameter = SstCompressNone;
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Unknown Sst CompressionMethod parameter \"" +
                                                         method + "\"");
            }
            return true;
        }
        return false;
    };

    // not really a parameter, but a convenient way to pass this around
    auto lf_SetIsRowMajorParameter = [&](const std::string key, int &parameter) {
        parameter = (io.m_ArrayOrder == adios2::ArrayOrdering::RowMajor);
        return true;
    };

    auto lf_SetMarshalMethodParameter = [&](const std::string key, size_t &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "ffs")
            {
                parameter = SstMarshalFFS;
            }
            else if (method == "bp")
            {
                parameter = SstMarshalBP;
            }
            else if (method == "bp5")
            {
                parameter = SstMarshalBP5;
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Unknown Sst MarshalMethod parameter \"" +
                                                         method + "\"");
            }
            return true;
        }
        return false;
    };

    auto lf_SetCPCommPatternParameter = [&](const std::string key, size_t &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "min")
            {
                parameter = SstCPCommMin;
            }
            else if (method == "peer")
            {
                parameter = SstCPCommPeer;
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Unknown Sst CPCommPattern parameter \"" +
                                                         method + "\"");
            }
            return true;
        }
        return false;
    };

    auto lf_SetQueueFullPolicyParameter = [&](const std::string key, size_t &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "block")
            {
                parameter = SstQueueFullBlock;
            }
            else if (method == "discard")
            {
                parameter = SstQueueFullDiscard;
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Unknown Sst QueueFullPolicy parameter \"" +
                                                         method + "\"");
            }
            return true;
        }
        return false;
    };

    auto lf_SetStepDistributionModeParameter = [&](const std::string key, size_t &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "alltoall")
            {
                parameter = StepsAllToAll;
            }
            else if (method == "roundrobin")
            {
                parameter = StepsRoundRobin;
            }
            else if (method == "ondemand")
            {
                parameter = StepsOnDemand;
            }
            else
            {
                helper::Throw<std::invalid_argument>(
                    "Engine", "SstParamParser", "ParseParams",
                    "Unknown Sst StepDistributionMode parameter \"" + method + "\"");
            }
            return true;
        }
        return false;
    };
    auto lf_SetSpecPreloadModeParameter = [&](const std::string key, int &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "off")
            {
                parameter = SpecPreloadOff;
            }
            else if (method == "on")
            {
                parameter = SpecPreloadOn;
            }
            else if (method == "auto")
            {
                parameter = SpecPreloadAuto;
            }
            else
            {
                helper::Throw<std::invalid_argument>(
                    "Engine", "SstParamParser", "ParseParams",
                    "Unknown Sst SpeculativePreloadMode parameter \"" + method + "\"");
            }
            return true;
        }
        return false;
    };

    Params.verbose = userOptions.sst.verbose;

#define get_params(Param, Type, Typedecl, Default)                                                 \
    Params.Param = Default;                                                                        \
    lf_Set##Type##Parameter(#Param, Params.Param);
    SST_FOREACH_PARAMETER_TYPE_4ARGS(get_params);
#undef get_params
}